

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int stbir__resize_allocated
              (stbir__info *info,void *input_data,int input_stride_in_bytes,void *output_data,
              int output_stride_in_bytes,int alpha_channel,stbir_uint32 flags,stbir_datatype type,
              stbir_edge edge_horizontal,stbir_edge edge_vertical,stbir_colorspace colorspace,
              void *tempmem,size_t tempmem_size_in_bytes)

{
  stbir_uint32 sVar1;
  int iVar2;
  int local_50;
  int local_4c;
  int width_stride_output;
  int width_stride_input;
  size_t memory_required;
  int alpha_channel_local;
  int output_stride_in_bytes_local;
  void *output_data_local;
  int input_stride_in_bytes_local;
  void *input_data_local;
  stbir__info *info_local;
  
  sVar1 = stbir__calculate_memory(info);
  local_4c = input_stride_in_bytes;
  if (input_stride_in_bytes == 0) {
    local_4c = info->channels * info->input_w * (uint)stbir__type_size[type];
  }
  local_50 = output_stride_in_bytes;
  if (output_stride_in_bytes == 0) {
    local_50 = info->channels * info->output_w * (uint)stbir__type_size[type];
  }
  if ((info->channels < 0) || (0x40 < info->channels)) {
    info_local._4_4_ = 0;
  }
  else if (info->horizontal_filter < (STBIR_FILTER_CATMULLROM|STBIR_FILTER_TRIANGLE)) {
    if (info->vertical_filter < (STBIR_FILTER_CATMULLROM|STBIR_FILTER_TRIANGLE)) {
      if (alpha_channel < 0) {
        flags = flags | 3;
      }
      if (alpha_channel < info->channels) {
        if (tempmem == (void *)0x0) {
          info_local._4_4_ = 0;
        }
        else if (tempmem_size_in_bytes < sVar1) {
          info_local._4_4_ = 0;
        }
        else {
          memset(tempmem,0,tempmem_size_in_bytes);
          info->input_data = input_data;
          info->input_stride_bytes = local_4c;
          info->output_data = output_data;
          info->output_stride_bytes = local_50;
          info->alpha_channel = alpha_channel;
          info->flags = flags;
          info->type = type;
          info->edge_horizontal = edge_horizontal;
          info->edge_vertical = edge_vertical;
          info->colorspace = colorspace;
          iVar2 = stbir__get_coefficient_width(info->horizontal_filter,info->horizontal_scale);
          info->horizontal_coefficient_width = iVar2;
          iVar2 = stbir__get_coefficient_width(info->vertical_filter,info->vertical_scale);
          info->vertical_coefficient_width = iVar2;
          iVar2 = stbir__get_filter_pixel_width(info->horizontal_filter,info->horizontal_scale);
          info->horizontal_filter_pixel_width = iVar2;
          iVar2 = stbir__get_filter_pixel_width(info->vertical_filter,info->vertical_scale);
          info->vertical_filter_pixel_width = iVar2;
          iVar2 = stbir__get_filter_pixel_margin(info->horizontal_filter,info->horizontal_scale);
          info->horizontal_filter_pixel_margin = iVar2;
          iVar2 = stbir__get_filter_pixel_margin(info->vertical_filter,info->vertical_scale);
          info->vertical_filter_pixel_margin = iVar2;
          info->ring_buffer_length_bytes = info->output_w * info->channels * 4;
          info->decode_buffer_pixels = info->input_w + info->horizontal_filter_pixel_margin * 2;
          info->horizontal_contributors = (stbir__contributors *)tempmem;
          info->horizontal_coefficients =
               (float *)((long)&info->horizontal_contributors->n0 +
                        (long)info->horizontal_contributors_size);
          info->vertical_contributors =
               (stbir__contributors *)
               ((long)info->horizontal_coefficients + (long)info->horizontal_coefficients_size);
          info->vertical_coefficients =
               (float *)((long)&info->vertical_contributors->n0 +
                        (long)info->vertical_contributors_size);
          info->decode_buffer =
               (float *)((long)info->vertical_coefficients + (long)info->vertical_coefficients_size)
          ;
          iVar2 = stbir__use_height_upsampling(info);
          if (iVar2 == 0) {
            info->horizontal_buffer =
                 (float *)((long)info->decode_buffer + (long)info->decode_buffer_size);
            info->ring_buffer =
                 (float *)((long)info->horizontal_buffer + (long)info->horizontal_buffer_size);
            info->encode_buffer = (float *)0x0;
          }
          else {
            info->horizontal_buffer = (float *)0x0;
            info->ring_buffer =
                 (float *)((long)info->decode_buffer + (long)info->decode_buffer_size);
            info->encode_buffer = (float *)((long)info->ring_buffer + (long)info->ring_buffer_size);
          }
          info->ring_buffer_begin_index = -1;
          stbir__calculate_filters
                    (info->horizontal_contributors,info->horizontal_coefficients,
                     info->horizontal_filter,info->horizontal_scale,info->horizontal_shift,
                     info->input_w,info->output_w);
          stbir__calculate_filters
                    (info->vertical_contributors,info->vertical_coefficients,info->vertical_filter,
                     info->vertical_scale,info->vertical_shift,info->input_h,info->output_h);
          iVar2 = stbir__use_height_upsampling(info);
          if (iVar2 == 0) {
            stbir__buffer_loop_downsample(info);
          }
          else {
            stbir__buffer_loop_upsample(info);
          }
          info_local._4_4_ = 1;
        }
      }
      else {
        info_local._4_4_ = 0;
      }
    }
    else {
      info_local._4_4_ = 0;
    }
  }
  else {
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

static int stbir__resize_allocated(stbir__info *info,
    const void* input_data, int input_stride_in_bytes,
    void* output_data, int output_stride_in_bytes,
    int alpha_channel, stbir_uint32 flags, stbir_datatype type,
    stbir_edge edge_horizontal, stbir_edge edge_vertical, stbir_colorspace colorspace,
    void* tempmem, size_t tempmem_size_in_bytes)
{
    size_t memory_required = stbir__calculate_memory(info);

    int width_stride_input = input_stride_in_bytes ? input_stride_in_bytes : info->channels * info->input_w * stbir__type_size[type];
    int width_stride_output = output_stride_in_bytes ? output_stride_in_bytes : info->channels * info->output_w * stbir__type_size[type];

#ifdef STBIR_DEBUG_OVERWRITE_TEST
#define OVERWRITE_ARRAY_SIZE 8
    unsigned char overwrite_output_before_pre[OVERWRITE_ARRAY_SIZE];
    unsigned char overwrite_tempmem_before_pre[OVERWRITE_ARRAY_SIZE];
    unsigned char overwrite_output_after_pre[OVERWRITE_ARRAY_SIZE];
    unsigned char overwrite_tempmem_after_pre[OVERWRITE_ARRAY_SIZE];

    size_t begin_forbidden = width_stride_output * (info->output_h - 1) + info->output_w * info->channels * stbir__type_size[type];
    memcpy(overwrite_output_before_pre, &((unsigned char*)output_data)[-OVERWRITE_ARRAY_SIZE], OVERWRITE_ARRAY_SIZE);
    memcpy(overwrite_output_after_pre, &((unsigned char*)output_data)[begin_forbidden], OVERWRITE_ARRAY_SIZE);
    memcpy(overwrite_tempmem_before_pre, &((unsigned char*)tempmem)[-OVERWRITE_ARRAY_SIZE], OVERWRITE_ARRAY_SIZE);
    memcpy(overwrite_tempmem_after_pre, &((unsigned char*)tempmem)[tempmem_size_in_bytes], OVERWRITE_ARRAY_SIZE);
#endif

    STBIR_ASSERT(info->channels >= 0);
    STBIR_ASSERT(info->channels <= STBIR_MAX_CHANNELS);

    if (info->channels < 0 || info->channels > STBIR_MAX_CHANNELS)
        return 0;

    STBIR_ASSERT(info->horizontal_filter < STBIR__ARRAY_SIZE(stbir__filter_info_table));
    STBIR_ASSERT(info->vertical_filter < STBIR__ARRAY_SIZE(stbir__filter_info_table));

    if (info->horizontal_filter >= STBIR__ARRAY_SIZE(stbir__filter_info_table))
        return 0;
    if (info->vertical_filter >= STBIR__ARRAY_SIZE(stbir__filter_info_table))
        return 0;

    if (alpha_channel < 0)
        flags |= STBIR_FLAG_ALPHA_USES_COLORSPACE | STBIR_FLAG_ALPHA_PREMULTIPLIED;

    if (!(flags&STBIR_FLAG_ALPHA_USES_COLORSPACE) || !(flags&STBIR_FLAG_ALPHA_PREMULTIPLIED)) {
        STBIR_ASSERT(alpha_channel >= 0 && alpha_channel < info->channels);
    }

    if (alpha_channel >= info->channels)
        return 0;

    STBIR_ASSERT(tempmem);

    if (!tempmem)
        return 0;

    STBIR_ASSERT(tempmem_size_in_bytes >= memory_required);

    if (tempmem_size_in_bytes < memory_required)
        return 0;

    memset(tempmem, 0, tempmem_size_in_bytes);

    info->input_data = input_data;
    info->input_stride_bytes = width_stride_input;

    info->output_data = output_data;
    info->output_stride_bytes = width_stride_output;

    info->alpha_channel = alpha_channel;
    info->flags = flags;
    info->type = type;
    info->edge_horizontal = edge_horizontal;
    info->edge_vertical = edge_vertical;
    info->colorspace = colorspace;

    info->horizontal_coefficient_width   = stbir__get_coefficient_width  (info->horizontal_filter, info->horizontal_scale);
    info->vertical_coefficient_width     = stbir__get_coefficient_width  (info->vertical_filter  , info->vertical_scale  );
    info->horizontal_filter_pixel_width  = stbir__get_filter_pixel_width (info->horizontal_filter, info->horizontal_scale);
    info->vertical_filter_pixel_width    = stbir__get_filter_pixel_width (info->vertical_filter  , info->vertical_scale  );
    info->horizontal_filter_pixel_margin = stbir__get_filter_pixel_margin(info->horizontal_filter, info->horizontal_scale);
    info->vertical_filter_pixel_margin   = stbir__get_filter_pixel_margin(info->vertical_filter  , info->vertical_scale  );

    info->ring_buffer_length_bytes = info->output_w * info->channels * sizeof(float);
    info->decode_buffer_pixels = info->input_w + info->horizontal_filter_pixel_margin * 2;

#define STBIR__NEXT_MEMPTR(current, newtype) (newtype*)(((unsigned char*)current) + current##_size)

    info->horizontal_contributors = (stbir__contributors *) tempmem;
    info->horizontal_coefficients = STBIR__NEXT_MEMPTR(info->horizontal_contributors, float);
    info->vertical_contributors = STBIR__NEXT_MEMPTR(info->horizontal_coefficients, stbir__contributors);
    info->vertical_coefficients = STBIR__NEXT_MEMPTR(info->vertical_contributors, float);
    info->decode_buffer = STBIR__NEXT_MEMPTR(info->vertical_coefficients, float);

    if (stbir__use_height_upsampling(info))
    {
        info->horizontal_buffer = NULL;
        info->ring_buffer = STBIR__NEXT_MEMPTR(info->decode_buffer, float);
        info->encode_buffer = STBIR__NEXT_MEMPTR(info->ring_buffer, float);

        STBIR_ASSERT((size_t)STBIR__NEXT_MEMPTR(info->encode_buffer, unsigned char) == (size_t)tempmem + tempmem_size_in_bytes);
    }
    else
    {
        info->horizontal_buffer = STBIR__NEXT_MEMPTR(info->decode_buffer, float);
        info->ring_buffer = STBIR__NEXT_MEMPTR(info->horizontal_buffer, float);
        info->encode_buffer = NULL;

        STBIR_ASSERT((size_t)STBIR__NEXT_MEMPTR(info->ring_buffer, unsigned char) == (size_t)tempmem + tempmem_size_in_bytes);
    }

#undef STBIR__NEXT_MEMPTR

    // This signals that the ring buffer is empty
    info->ring_buffer_begin_index = -1;

    stbir__calculate_filters(info->horizontal_contributors, info->horizontal_coefficients, info->horizontal_filter, info->horizontal_scale, info->horizontal_shift, info->input_w, info->output_w);
    stbir__calculate_filters(info->vertical_contributors, info->vertical_coefficients, info->vertical_filter, info->vertical_scale, info->vertical_shift, info->input_h, info->output_h);

    STBIR_PROGRESS_REPORT(0);

    if (stbir__use_height_upsampling(info))
        stbir__buffer_loop_upsample(info);
    else
        stbir__buffer_loop_downsample(info);

    STBIR_PROGRESS_REPORT(1);

#ifdef STBIR_DEBUG_OVERWRITE_TEST
    STBIR_ASSERT(memcmp(overwrite_output_before_pre, &((unsigned char*)output_data)[-OVERWRITE_ARRAY_SIZE], OVERWRITE_ARRAY_SIZE) == 0);
    STBIR_ASSERT(memcmp(overwrite_output_after_pre, &((unsigned char*)output_data)[begin_forbidden], OVERWRITE_ARRAY_SIZE) == 0);
    STBIR_ASSERT(memcmp(overwrite_tempmem_before_pre, &((unsigned char*)tempmem)[-OVERWRITE_ARRAY_SIZE], OVERWRITE_ARRAY_SIZE) == 0);
    STBIR_ASSERT(memcmp(overwrite_tempmem_after_pre, &((unsigned char*)tempmem)[tempmem_size_in_bytes], OVERWRITE_ARRAY_SIZE) == 0);
#endif

    return 1;
}